

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<vec<int>>::vec<vec<int>>(vec<vec<int>> *this,vec<vec<int>_> *other)

{
  uint uVar1;
  void *pvVar2;
  uint i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = other->sz;
  uVar4 = (ulong)uVar1;
  *(uint *)this = uVar1;
  *(uint *)(this + 4) = uVar1;
  pvVar2 = malloc(uVar4 << 4);
  *(void **)(this + 8) = pvVar2;
  lVar5 = 0;
  for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    vec<int>::vec<int>((vec<int> *)(*(long *)(this + 8) + lVar5),
                       (vec<int> *)((long)&other->data->sz + lVar5));
    uVar4 = (ulong)*(uint *)this;
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}